

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.hh
# Opt level: O0

void __thiscall
tchecker::graph::directed::
graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>>
::
clear<std::__detail::_Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>,true,true>,std::__detail::_Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>,true,true>>
          (graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>>
           *this,_Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
                 *begin,
          _Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
          *end)

{
  bool bVar1;
  reference n;
  _Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true>
  local_28;
  _Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
  it;
  _Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
  *end_local;
  _Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
  *begin_local;
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
  *this_local;
  
  local_28._M_cur =
       (begin->
       super__Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true>
       )._M_cur;
  it.
  super__Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true>
  ._M_cur = (_Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true>
             )(_Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true>
               )end;
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&local_28,
                       (_Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true>
                        *)it.
                          super__Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true>
                          ._M_cur);
    if (!bVar1) break;
    n = std::__detail::
        _Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
        ::operator*((_Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
                     *)&local_28);
    graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
    ::remove_edges((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
                    *)this,n);
    std::__detail::
    _Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
    ::operator++((_Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
                  *)&local_28);
  }
  return;
}

Assistant:

void clear(NODES_BEGIN const & begin, NODES_END const & end)
  {
    for (NODES_BEGIN it = begin; it != end; ++it)
      remove_edges(*it);
  }